

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

void xmlNanoFTPScanURL(void *ctx,char *URL)

{
  xmlURIPtr uri_00;
  char *pcVar1;
  xmlChar *pxVar2;
  char *cptr;
  xmlURIPtr uri;
  xmlNanoFTPCtxtPtr ctxt;
  char *URL_local;
  void *ctx_local;
  
  if (*ctx != 0) {
    (*xmlFree)(*ctx);
    *(undefined8 *)ctx = 0;
  }
  if (*(long *)((long)ctx + 8) != 0) {
    (*xmlFree)(*(void **)((long)ctx + 8));
    *(undefined8 *)((long)ctx + 8) = 0;
  }
  if (*(long *)((long)ctx + 0x18) != 0) {
    (*xmlFree)(*(void **)((long)ctx + 0x18));
    *(undefined8 *)((long)ctx + 0x18) = 0;
  }
  if ((URL != (char *)0x0) && (uri_00 = xmlParseURIRaw(URL,1), uri_00 != (xmlURIPtr)0x0)) {
    if ((uri_00->scheme == (char *)0x0) || (uri_00->server == (char *)0x0)) {
      xmlFreeURI(uri_00);
    }
    else {
      pcVar1 = (*xmlMemStrdup)(uri_00->scheme);
      *(char **)ctx = pcVar1;
      pcVar1 = (*xmlMemStrdup)(uri_00->server);
      *(char **)((long)ctx + 8) = pcVar1;
      if (uri_00->path == (char *)0x0) {
        pcVar1 = (*xmlMemStrdup)("/");
        *(char **)((long)ctx + 0x18) = pcVar1;
      }
      else {
        pcVar1 = (*xmlMemStrdup)(uri_00->path);
        *(char **)((long)ctx + 0x18) = pcVar1;
      }
      if (uri_00->port != 0) {
        *(int *)((long)ctx + 0x10) = uri_00->port;
      }
      if (uri_00->user != (char *)0x0) {
        pcVar1 = strchr(uri_00->user,0x3a);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = (*xmlMemStrdup)(uri_00->user);
          *(char **)((long)ctx + 0x20) = pcVar1;
        }
        else {
          pxVar2 = xmlStrndup((xmlChar *)uri_00->user,(int)pcVar1 - (int)uri_00->user);
          *(xmlChar **)((long)ctx + 0x20) = pxVar2;
          pcVar1 = (*xmlMemStrdup)(pcVar1 + 1);
          *(char **)((long)ctx + 0x28) = pcVar1;
        }
      }
      xmlFreeURI(uri_00);
    }
  }
  return;
}

Assistant:

static void
xmlNanoFTPScanURL(void *ctx, const char *URL) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    xmlURIPtr uri;

    /*
     * Clear any existing data from the context
     */
    if (ctxt->protocol != NULL) {
        xmlFree(ctxt->protocol);
	ctxt->protocol = NULL;
    }
    if (ctxt->hostname != NULL) {
        xmlFree(ctxt->hostname);
	ctxt->hostname = NULL;
    }
    if (ctxt->path != NULL) {
        xmlFree(ctxt->path);
	ctxt->path = NULL;
    }
    if (URL == NULL) return;

    uri = xmlParseURIRaw(URL, 1);
    if (uri == NULL)
	return;

    if ((uri->scheme == NULL) || (uri->server == NULL)) {
	xmlFreeURI(uri);
	return;
    }

    ctxt->protocol = xmlMemStrdup(uri->scheme);
    ctxt->hostname = xmlMemStrdup(uri->server);
    if (uri->path != NULL)
	ctxt->path = xmlMemStrdup(uri->path);
    else
	ctxt->path = xmlMemStrdup("/");
    if (uri->port != 0)
	ctxt->port = uri->port;

    if (uri->user != NULL) {
	char *cptr;
	if ((cptr=strchr(uri->user, ':')) == NULL)
	    ctxt->user = xmlMemStrdup(uri->user);
	else {
	    ctxt->user = (char *)xmlStrndup((xmlChar *)uri->user,
			    (cptr - uri->user));
	    ctxt->passwd = xmlMemStrdup(cptr+1);
	}
    }

    xmlFreeURI(uri);

}